

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_e58190::HandleWriteImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool append,cmExecutionStatus *status)

{
  string *in_name;
  pointer pbVar1;
  _Ios_Openmode _Var2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  string *a;
  Status SVar6;
  mode_t mode;
  string fileName;
  string error_1;
  string dir;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream file;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  in_name = pbVar1 + 1;
  std::__cxx11::string::string((string *)&fileName,(string *)in_name);
  bVar5 = cmsys::SystemTools::FileIsFullPath(in_name);
  if (!bVar5) {
    a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
    dir._M_dataplus._M_p._0_1_ = 0x2f;
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
              ((string *)&file,a,(char *)&dir,in_name);
    std::__cxx11::string::operator=((string *)&fileName,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
  }
  bVar5 = cmMakefile::CanIWriteThisFile(status->Makefile,&fileName);
  if (bVar5) {
    cmsys::SystemTools::GetFilenamePath(&dir,&fileName);
    cmsys::SystemTools::MakeDirectory(&dir,(mode_t *)0x0);
    mode = 0;
    SVar6 = cmsys::SystemTools::GetPermissions(&fileName,&mode);
    if (SVar6.Kind_ == Success) {
      bVar4 = true;
      if (-1 < (char)mode) {
        bVar4 = false;
        cmsys::SystemTools::SetPermissions(&fileName,mode | 0x90,false);
      }
    }
    else {
      bVar4 = false;
    }
    _Var2 = _S_out;
    if (append) {
      _Var2 = _S_app;
    }
    std::ofstream::ofstream(&file,fileName._M_dataplus._M_p,_Var2);
    if (((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
        ) == 0) {
      local_248._M_dataplus._M_p = (pointer)(pbVar1 + 2);
      local_248._M_string_length =
           (size_type)
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      error_1._M_dataplus._M_p = (pointer)&error_1.field_2;
      error_1._M_string_length = 0;
      error_1.field_2._M_local_buf[0] = '\0';
      auVar3._8_8_ = 0;
      auVar3._0_8_ = error_1._M_dataplus._M_p;
      cmJoin(&message,(cmStringRange *)&local_248,(string_view)(auVar3 << 0x40),
             (string_view)ZEXT816(0));
      std::__cxx11::string::~string((string *)&error_1);
      std::operator<<(&file.super_basic_ostream<char,_std::char_traits<char>_>,(string *)&message);
      bVar5 = ((&file.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
               [(long)file.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]] & 5) == 0;
      if (bVar5) {
        std::ofstream::close();
        if (!bVar4 && mode != 0) {
          cmsys::SystemTools::SetPermissions(&fileName,mode,false);
        }
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmStrCat<char_const(&)[15],std::__cxx11::string,char_const(&)[6],std::__cxx11::string&>
                  (&error_1,(char (*) [15])"write failed (",&local_248,(char (*) [6])"):\n  ",
                   &fileName);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&error_1);
      }
      std::__cxx11::string::~string((string *)&message);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      cmStrCat<char_const(&)[29],std::__cxx11::string,char_const(&)[6],std::__cxx11::string&>
                (&message,(char (*) [29])"failed to open for writing (",&error_1,
                 (char (*) [6])"):\n  ",&fileName);
      std::__cxx11::string::~string((string *)&error_1);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&message);
      bVar5 = false;
    }
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    std::operator+(&dir,"attempted to write a file: ",&fileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,&dir,
                   " into a source directory.");
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::string::~string((string *)&file);
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&fileName);
  return bVar5;
}

Assistant:

bool HandleWriteImpl(std::vector<std::string> const& args, bool append,
                     cmExecutionStatus& status)
{
  auto i = args.begin();

  i++; // Get rid of subcommand

  std::string fileName = *i;
  if (!cmsys::SystemTools::FileIsFullPath(*i)) {
    fileName =
      cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', *i);
  }

  i++;

  if (!status.GetMakefile().CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    status.SetError(e);
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }
  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName, mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName, newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       append ? std::ios::app : std::ios::out);
  if (!file) {
    std::string error =
      cmStrCat("failed to open for writing (",
               cmSystemTools::GetLastSystemError(), "):\n  ", fileName);
    status.SetError(error);
    return false;
  }
  std::string message = cmJoin(cmMakeRange(i, args.end()), std::string());
  file << message;
  if (!file) {
    std::string error =
      cmStrCat("write failed (", cmSystemTools::GetLastSystemError(), "):\n  ",
               fileName);
    status.SetError(error);
    return false;
  }
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName, mode);
  }
  return true;
}